

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

csubstr c4::yml::from_tag_long(YamlTag_e tag)

{
  undefined2 in_DI;
  csubstr local_10;
  
  switch(in_DI) {
  case 0:
    basic_substring<char_const>::basic_substring<1ul>
              ((basic_substring<char_const> *)&local_10,(char (*) [1])0x3410df);
    break;
  case 1:
    basic_substring<char_const>::basic_substring<24ul>
              ((basic_substring<char_const> *)&local_10,(char (*) [24])"<tag:yaml.org,2002:map>");
    break;
  case 2:
    basic_substring<char_const>::basic_substring<25ul>
              ((basic_substring<char_const> *)&local_10,(char (*) [25])"<tag:yaml.org,2002:omap>");
    break;
  case 3:
    basic_substring<char_const>::basic_substring<26ul>
              ((basic_substring<char_const> *)&local_10,(char (*) [26])"<tag:yaml.org,2002:pairs>");
    break;
  case 4:
    basic_substring<char_const>::basic_substring<24ul>
              ((basic_substring<char_const> *)&local_10,(char (*) [24])"<tag:yaml.org,2002:set>");
    break;
  case 5:
    basic_substring<char_const>::basic_substring<24ul>
              ((basic_substring<char_const> *)&local_10,(char (*) [24])"<tag:yaml.org,2002:seq>");
    break;
  case 6:
    basic_substring<char_const>::basic_substring<27ul>
              ((basic_substring<char_const> *)&local_10,(char (*) [27])"<tag:yaml.org,2002:binary>")
    ;
    break;
  case 7:
    basic_substring<char_const>::basic_substring<25ul>
              ((basic_substring<char_const> *)&local_10,(char (*) [25])"<tag:yaml.org,2002:bool>");
    break;
  case 8:
    basic_substring<char_const>::basic_substring<26ul>
              ((basic_substring<char_const> *)&local_10,(char (*) [26])"<tag:yaml.org,2002:float>");
    break;
  case 9:
    basic_substring<char_const>::basic_substring<24ul>
              ((basic_substring<char_const> *)&local_10,(char (*) [24])"<tag:yaml.org,2002:int>");
    break;
  case 10:
    basic_substring<char_const>::basic_substring<26ul>
              ((basic_substring<char_const> *)&local_10,(char (*) [26])"<tag:yaml.org,2002:merge>");
    break;
  case 0xb:
    basic_substring<char_const>::basic_substring<25ul>
              ((basic_substring<char_const> *)&local_10,(char (*) [25])"<tag:yaml.org,2002:null>");
    break;
  case 0xc:
    basic_substring<char_const>::basic_substring<24ul>
              ((basic_substring<char_const> *)&local_10,(char (*) [24])"<tag:yaml.org,2002:str>");
    break;
  case 0xd:
    basic_substring<char_const>::basic_substring<30ul>
              ((basic_substring<char_const> *)&local_10,
               (char (*) [30])"<tag:yaml.org,2002:timestamp>");
    break;
  case 0xe:
    basic_substring<char_const>::basic_substring<26ul>
              ((basic_substring<char_const> *)&local_10,(char (*) [26])"<tag:yaml.org,2002:value>");
    break;
  case 0xf:
    basic_substring<char_const>::basic_substring<25ul>
              ((basic_substring<char_const> *)&local_10,(char (*) [25])"<tag:yaml.org,2002:yaml>");
    break;
  default:
    basic_substring<char_const>::basic_substring<1ul>
              ((basic_substring<char_const> *)&local_10,(char (*) [1])0x3410df);
  }
  return local_10;
}

Assistant:

csubstr from_tag_long(YamlTag_e tag)
{
    switch(tag)
    {
    case TAG_MAP:
        return {"<tag:yaml.org,2002:map>"};
    case TAG_OMAP:
        return {"<tag:yaml.org,2002:omap>"};
    case TAG_PAIRS:
        return {"<tag:yaml.org,2002:pairs>"};
    case TAG_SET:
        return {"<tag:yaml.org,2002:set>"};
    case TAG_SEQ:
        return {"<tag:yaml.org,2002:seq>"};
    case TAG_BINARY:
        return {"<tag:yaml.org,2002:binary>"};
    case TAG_BOOL:
        return {"<tag:yaml.org,2002:bool>"};
    case TAG_FLOAT:
        return {"<tag:yaml.org,2002:float>"};
    case TAG_INT:
        return {"<tag:yaml.org,2002:int>"};
    case TAG_MERGE:
        return {"<tag:yaml.org,2002:merge>"};
    case TAG_NULL:
        return {"<tag:yaml.org,2002:null>"};
    case TAG_STR:
        return {"<tag:yaml.org,2002:str>"};
    case TAG_TIMESTAMP:
        return {"<tag:yaml.org,2002:timestamp>"};
    case TAG_VALUE:
        return {"<tag:yaml.org,2002:value>"};
    case TAG_YAML:
        return {"<tag:yaml.org,2002:yaml>"};
    case TAG_NONE:
        return {""};
    }
    return {""};
}